

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

int32_t upb_test_TestExtensions_optional_int32_ext(upb_test_TestExtensions *msg)

{
  bool bVar1;
  upb_FieldRep uVar2;
  int32_t local_20 [2];
  int32_t ret;
  int32_t default_val;
  upb_MiniTableExtension *ext;
  upb_test_TestExtensions *msg_local;
  
  _ret = &upb_test_TestExtensions_optional_int32_ext_ext;
  ext = (upb_MiniTableExtension *)msg;
  bVar1 = upb_MiniTableField_IsScalar
                    (&upb_test_TestExtensions_optional_int32_ext_ext.
                      field_dont_copy_me__upb_internal_use_only);
  if (!bVar1) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                  ,0xcec,
                  "int32_t upb_test_TestExtensions_optional_int32_ext(const struct upb_test_TestExtensions *)"
                 );
  }
  uVar2 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only
                    (&_ret->field_dont_copy_me__upb_internal_use_only);
  if (uVar2 == kUpb_FieldRep_4Byte) {
    local_20[1] = 0;
    _upb_Message_GetExtensionField((upb_Message *)ext,_ret,local_20 + 1,local_20);
    return local_20[0];
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                ,0xcee,
                "int32_t upb_test_TestExtensions_optional_int32_ext(const struct upb_test_TestExtensions *)"
               );
}

Assistant:

UPB_INLINE int32_t upb_test_TestExtensions_optional_int32_ext(const struct upb_test_TestExtensions* msg) {
  const upb_MiniTableExtension* ext = &upb_test_TestExtensions_optional_int32_ext_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == kUpb_FieldRep_4Byte);
  int32_t default_val = (int32_t)0;
  int32_t ret;
  _upb_Message_GetExtensionField((upb_Message*)msg, ext, &default_val, &ret);
  return ret;
}